

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CacheInstArray(Fts5Cursor *pCsr)

{
  Fts5PoslistReader *pFVar1;
  int *piVar2;
  int local_5c;
  int local_54;
  int iBest;
  int *aInst;
  u8 *puStack_40;
  int n;
  u8 *a;
  int i;
  int nInst;
  sqlite3_int64 nByte;
  int nCol;
  int nIter;
  Fts5PoslistReader *aIter;
  Fts5Cursor *pFStack_10;
  int rc;
  Fts5Cursor *pCsr_local;
  
  aIter._4_4_ = 0;
  nByte._0_4_ = *(int *)&((pCsr->base).pVtab[1].pModule)->xBestIndex;
  pFStack_10 = pCsr;
  nByte._4_4_ = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  if (pFStack_10->aInstIter == (Fts5PoslistReader *)0x0) {
    _i = (long)nByte._4_4_ << 5;
    pFVar1 = (Fts5PoslistReader *)sqlite3Fts5MallocZero((int *)((long)&aIter + 4),_i);
    pFStack_10->aInstIter = pFVar1;
  }
  _nCol = pFStack_10->aInstIter;
  if (_nCol != (Fts5PoslistReader *)0x0) {
    a._4_4_ = 0;
    for (a._0_4_ = 0; (int)a < nByte._4_4_ && aIter._4_4_ == 0; a._0_4_ = (int)a + 1) {
      aIter._4_4_ = fts5CsrPoslist(pFStack_10,(int)a,&stack0xffffffffffffffc0,
                                   (int *)((long)&aInst + 4));
      if (aIter._4_4_ == 0) {
        sqlite3Fts5PoslistReaderInit(puStack_40,aInst._4_4_,_nCol + (int)a);
      }
    }
    if (aIter._4_4_ == 0) {
      while( true ) {
        local_54 = -1;
        for (a._0_4_ = 0; (int)a < nByte._4_4_; a._0_4_ = (int)a + 1) {
          if ((_nCol[(int)a].bEof == '\0') &&
             ((local_54 < 0 || (_nCol[(int)a].iPos < _nCol[local_54].iPos)))) {
            local_54 = (int)a;
          }
        }
        if (local_54 < 0) goto LAB_001e24d1;
        a._4_4_ = a._4_4_ + 1;
        if (pFStack_10->nInstAlloc <= a._4_4_) {
          if (pFStack_10->nInstAlloc == 0) {
            local_5c = 0x20;
          }
          else {
            local_5c = pFStack_10->nInstAlloc << 1;
          }
          pFStack_10->nInstAlloc = local_5c;
          piVar2 = (int *)sqlite3_realloc64(pFStack_10->aInst,(long)pFStack_10->nInstAlloc * 0xc);
          if (piVar2 == (int *)0x0) {
            aIter._4_4_ = 7;
            goto LAB_001e24d1;
          }
          pFStack_10->aInst = piVar2;
        }
        piVar2 = pFStack_10->aInst + (a._4_4_ + -1) * 3;
        *piVar2 = local_54;
        piVar2[1] = (int)((ulong)_nCol[local_54].iPos >> 0x20);
        piVar2[2] = (uint)_nCol[local_54].iPos & 0x7fffffff;
        if ((piVar2[1] < 0) || ((int)nByte <= piVar2[1])) break;
        sqlite3Fts5PoslistReaderNext(_nCol + local_54);
      }
      aIter._4_4_ = 0x10b;
    }
LAB_001e24d1:
    pFStack_10->nInstCount = a._4_4_;
    pFStack_10->csrflags = pFStack_10->csrflags & 0xfffffff7;
  }
  return aIter._4_4_;
}

Assistant:

static int fts5CacheInstArray(Fts5Cursor *pCsr){
  int rc = SQLITE_OK;
  Fts5PoslistReader *aIter;       /* One iterator for each phrase */
  int nIter;                      /* Number of iterators/phrases */
  int nCol = ((Fts5Table*)pCsr->base.pVtab)->pConfig->nCol;
  
  nIter = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  if( pCsr->aInstIter==0 ){
    sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nIter;
    pCsr->aInstIter = (Fts5PoslistReader*)sqlite3Fts5MallocZero(&rc, nByte);
  }
  aIter = pCsr->aInstIter;

  if( aIter ){
    int nInst = 0;                /* Number instances seen so far */
    int i;

    /* Initialize all iterators */
    for(i=0; i<nIter && rc==SQLITE_OK; i++){
      const u8 *a;
      int n; 
      rc = fts5CsrPoslist(pCsr, i, &a, &n);
      if( rc==SQLITE_OK ){
        sqlite3Fts5PoslistReaderInit(a, n, &aIter[i]);
      }
    }

    if( rc==SQLITE_OK ){
      while( 1 ){
        int *aInst;
        int iBest = -1;
        for(i=0; i<nIter; i++){
          if( (aIter[i].bEof==0) 
              && (iBest<0 || aIter[i].iPos<aIter[iBest].iPos) 
            ){
            iBest = i;
          }
        }
        if( iBest<0 ) break;

        nInst++;
        if( nInst>=pCsr->nInstAlloc ){
          pCsr->nInstAlloc = pCsr->nInstAlloc ? pCsr->nInstAlloc*2 : 32;
          aInst = (int*)sqlite3_realloc64(
              pCsr->aInst, pCsr->nInstAlloc*sizeof(int)*3
              );
          if( aInst ){
            pCsr->aInst = aInst;
          }else{
            rc = SQLITE_NOMEM;
            break;
          }
        }

        aInst = &pCsr->aInst[3 * (nInst-1)];
        aInst[0] = iBest;
        aInst[1] = FTS5_POS2COLUMN(aIter[iBest].iPos);
        aInst[2] = FTS5_POS2OFFSET(aIter[iBest].iPos);
        if( aInst[1]<0 || aInst[1]>=nCol ){
          rc = FTS5_CORRUPT;
          break;
        }
        sqlite3Fts5PoslistReaderNext(&aIter[iBest]);
      }
    }

    pCsr->nInstCount = nInst;
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_INST);
  }
  return rc;
}